

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<QRhiBufferData,_4LL>::append
          (QVarLengthArray<QRhiBufferData,_4LL> *this,QRhiBufferData *t)

{
  size_type sVar1;
  size_type sVar2;
  QRhiBufferData *in_RSI;
  QVarLengthArray<QRhiBufferData,_4LL> *in_RDI;
  long in_FS_OFFSET;
  QRhiBufferData *in_stack_ffffffffffffffc8;
  QRhiBufferData local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = QVLABaseBase::size((QVLABaseBase *)in_RDI);
  sVar2 = QVLABaseBase::capacity((QVLABaseBase *)in_RDI);
  if (sVar1 == sVar2) {
    QRhiBufferData::QRhiBufferData(&local_10,in_RSI);
    emplace_back<QRhiBufferData>(in_RDI,in_stack_ffffffffffffffc8);
    QRhiBufferData::~QRhiBufferData((QRhiBufferData *)in_RDI);
  }
  else {
    QVarLengthArray<QRhiBufferData,4ll>::emplace_back<QRhiBufferData_const&>
              (in_RDI,in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void append(const T &t)
    {
        if (size() == capacity())
            emplace_back(T(t));
        else
            emplace_back(t);
    }